

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PerPatchDataCase::init
          (PerPatchDataCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  pointer pbVar2;
  Context *this_00;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar3;
  bool bVar4;
  bool bVar5;
  RenderTarget *renderTarget;
  long *plVar6;
  undefined8 *puVar7;
  ShaderProgram *this_01;
  SharedPtrStateBase *pSVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  TestError *this_02;
  undefined1 usePointMode;
  size_type *psVar10;
  size_type *psVar11;
  pointer pbVar12;
  ContextInfo *pCVar13;
  ulong *puVar14;
  Context *code;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType primType;
  long extraout_RDX;
  pointer pcVar15;
  char *__s;
  undefined8 uVar16;
  long lVar17;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string outSizeStr;
  string inSizeStr;
  string local_3a8;
  size_type *local_388;
  value_type local_380;
  size_type *local_360;
  value_type local_358;
  string local_338;
  size_type *local_318;
  value_type local_310;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Context *local_288;
  long local_280;
  Context local_278;
  long local_260;
  undefined1 local_258 [16];
  ContextInfo *local_248;
  undefined1 local_238 [24];
  pointer local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [24];
  pointer pbStack_190;
  ios_base local_138 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_118;
  undefined1 local_f8 [200];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_248 = (ContextInfo *)local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_1e8);
  plVar6 = (long *)std::__cxx11::string::append(local_2f0);
  local_360 = &local_358._M_string_length;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    local_358._M_string_length = *psVar10;
    local_358.field_2._M_allocated_capacity = plVar6[3];
  }
  else {
    local_358._M_string_length = *psVar10;
    local_360 = (size_type *)*plVar6;
  }
  local_358._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_388 = &local_380._M_string_length;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    local_380._M_string_length = *psVar10;
    local_380.field_2._M_allocated_capacity = plVar6[3];
  }
  else {
    local_380._M_string_length = *psVar10;
    local_388 = (size_type *)*plVar6;
  }
  local_380._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_388);
  psVar10 = &local_310._M_string_length;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_310._M_string_length = *psVar11;
    local_310.field_2._M_allocated_capacity = plVar6[3];
    local_318 = psVar10;
  }
  else {
    local_310._M_string_length = *psVar11;
    local_318 = (size_type *)*plVar6;
  }
  local_310._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
  pbVar2 = (pointer)(local_1a8 + 0x10);
  pbVar12 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pbVar12) {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar6[3];
    local_1a8._0_8_ = pbVar2;
  }
  else {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar6;
  }
  local_1a8._8_8_ = plVar6[1];
  *plVar6 = (long)pbVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_1a8);
  local_278.m_contextInfo = (ContextInfo *)local_258;
  pCVar13 = (ContextInfo *)(plVar6 + 2);
  if ((ContextInfo *)*plVar6 == pCVar13) {
    local_258._0_8_ = pCVar13->_vptr_ContextInfo;
    local_258._8_8_ = plVar6[3];
  }
  else {
    local_258._0_8_ = pCVar13->_vptr_ContextInfo;
    local_278.m_contextInfo = (ContextInfo *)*plVar6;
  }
  lVar17 = plVar6[1];
  *plVar6 = (long)pCVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_260 = lVar17;
  if ((pointer)local_1a8._0_8_ != pbVar2) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
    lVar17 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar13,0);
  primType = (TessPrimitiveType)lVar17;
  if (local_318 != psVar10) {
    operator_delete(local_318,local_310._M_string_length + 1);
    primType = extraout_EDX;
  }
  if (local_388 != &local_380._M_string_length) {
    operator_delete(local_388,local_380._M_string_length + 1);
    primType = extraout_EDX_00;
  }
  if (local_360 != &local_358._M_string_length) {
    operator_delete(local_360,local_358._M_string_length + 1);
    primType = extraout_EDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != &local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
    primType = extraout_EDX_02;
  }
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_2c8,(_anonymous_namespace_ *)&DAT_00000001,primType,(bool)usePointMode)
  ;
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,0x96eea1);
  local_2f0._0_8_ = &local_2e0;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar9) {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2e0._8_8_ = plVar6[3];
  }
  else {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2f0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_2f0._8_8_ = plVar6[1];
  *plVar6 = (long)paVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_2f0);
  local_360 = &local_358._M_string_length;
  puVar14 = (ulong *)(plVar6 + 2);
  if ((size_type *)*plVar6 == puVar14) {
    local_358._M_string_length = *puVar14;
    local_358.field_2._M_allocated_capacity = plVar6[3];
  }
  else {
    local_358._M_string_length = *puVar14;
    local_360 = (size_type *)*plVar6;
  }
  local_358._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)puVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"patch in mediump int in_te_patchVerticesInFromTCS;\n","");
  }
  else if (this->m_caseType == CASETYPE_PRIMITIVE_ID_TCS) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"patch in mediump int in_te_primitiveIDFromTCS;\n","");
  }
  else {
    local_338._M_string_length = 0;
    local_338.field_2._M_local_buf[0] = '\0';
  }
  pcVar15 = (pointer)0xf;
  if (local_360 != &local_358._M_string_length) {
    pcVar15 = (pointer)local_358._M_string_length;
  }
  if (pcVar15 < local_358._M_dataplus._M_p + local_338._M_string_length) {
    pcVar15 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      pcVar15 = (pointer)CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                                  local_338.field_2._M_local_buf[0]);
    }
    if (pcVar15 < local_358._M_dataplus._M_p + local_338._M_string_length) goto LAB_003cefc9;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,(ulong)local_360);
  }
  else {
LAB_003cefc9:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_338._M_dataplus._M_p);
  }
  local_388 = &local_380._M_string_length;
  psVar11 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar11) {
    local_380._M_string_length = *psVar11;
    local_380.field_2._M_allocated_capacity = puVar7[3];
  }
  else {
    local_380._M_string_length = *psVar11;
    local_388 = (size_type *)*puVar7;
  }
  local_380._M_dataplus._M_p = (pointer)puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_388);
  puVar14 = (ulong *)(plVar6 + 2);
  if ((size_type *)*plVar6 == puVar14) {
    local_310._M_string_length = *puVar14;
    local_310.field_2._M_allocated_capacity = plVar6[3];
    local_318 = psVar10;
  }
  else {
    local_310._M_string_length = *puVar14;
    local_318 = (size_type *)*plVar6;
  }
  local_310._M_dataplus._M_p = (pointer)plVar6[1];
  *plVar6 = (long)puVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  switch(this->m_caseType) {
  case CASETYPE_PRIMITIVE_ID_TCS:
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3a8,"\tbool ok = in_te_primitiveIDFromTCS == 3;\n","");
    goto LAB_003cf1b9;
  case CASETYPE_PRIMITIVE_ID_TES:
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3a8,"\tbool ok = gl_PrimitiveID == 3;\n","");
LAB_003cf1b9:
    bVar5 = false;
    bVar4 = false;
    goto LAB_003cf254;
  case CASETYPE_PATCH_VERTICES_IN_TCS:
    std::operator+(&local_2a8,"\tbool ok = in_te_patchVerticesInFromTCS == ",&local_1c8);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    puVar14 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_3a8.field_2._M_allocated_capacity = *puVar14;
      local_3a8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_3a8.field_2._M_allocated_capacity = *puVar14;
      local_3a8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_3a8._M_string_length = puVar7[1];
    *puVar7 = puVar14;
    bVar5 = true;
    bVar4 = false;
    goto LAB_003cf247;
  case CASETYPE_PATCH_VERTICES_IN_TES:
    std::operator+(&local_2a8,"\tbool ok = gl_PatchVerticesIn == ",&local_1e8);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    puVar14 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_3a8.field_2._M_allocated_capacity = *puVar14;
      local_3a8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_3a8.field_2._M_allocated_capacity = *puVar14;
      local_3a8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_3a8._M_string_length = puVar7[1];
    *puVar7 = puVar14;
    bVar4 = true;
    bVar5 = false;
LAB_003cf247:
    puVar7[1] = 0;
    *(undefined1 *)puVar14 = 0;
    goto LAB_003cf254;
  case CASETYPE_TESS_LEVEL_INNER0_TES:
    __s = "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_INNER1_TES:
    __s = "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_OUTER0_TES:
    __s = "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_OUTER1_TES:
    __s = "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_OUTER2_TES:
    __s = "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n";
    break;
  default:
    __s = (char *)0x0;
    if (this->m_caseType == CASETYPE_TESS_LEVEL_OUTER3_TES) {
      __s = "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,__s,(allocator<char> *)&local_2a8);
  bVar5 = false;
  bVar4 = false;
LAB_003cf254:
  pcVar15 = (pointer)0xf;
  if (local_318 != psVar10) {
    pcVar15 = (pointer)local_310._M_string_length;
  }
  if (pcVar15 < local_310._M_dataplus._M_p + local_3a8._M_string_length) {
    uVar16 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      uVar16 = local_3a8.field_2._M_allocated_capacity;
    }
    if (local_310._M_dataplus._M_p + local_3a8._M_string_length <= (ulong)uVar16) {
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_318);
      goto LAB_003cf2bd;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_318,(ulong)local_3a8._M_dataplus._M_p);
LAB_003cf2bd:
  pbVar12 = (pointer)(plVar6 + 2);
  if ((pointer)*plVar6 == pbVar12) {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar6[3];
    local_1a8._0_8_ = pbVar2;
  }
  else {
    local_1a8._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar6;
  }
  local_1a8._8_8_ = plVar6[1];
  *plVar6 = (long)pbVar12;
  plVar6[1] = 0;
  *(undefined1 *)&(pbVar12->_M_dataplus)._M_p = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_1a8);
  local_288 = &local_278;
  code = (Context *)(plVar6 + 2);
  if ((Context *)*plVar6 == code) {
    local_278.m_testCtx = code->m_testCtx;
    local_278.m_renderCtx = (RenderContext *)plVar6[3];
  }
  else {
    local_278.m_testCtx = code->m_testCtx;
    local_288 = (Context *)*plVar6;
  }
  local_280 = plVar6[1];
  *plVar6 = (long)code;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != pbVar2) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2)) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != psVar10) {
    operator_delete(local_318,(ulong)(local_310._M_string_length + 1));
  }
  if (local_388 != &local_380._M_string_length) {
    operator_delete(local_388,local_380._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,
                    CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                             local_338.field_2._M_local_buf[0]) + 1);
  }
  if (local_360 != &local_358._M_string_length) {
    operator_delete(local_360,(ulong)(local_358._M_string_length + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != &local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
  }
  if ((Context *)local_2c8._0_8_ != (Context *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  local_2c8._0_8_ = (Context *)(local_2c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_f8[0x10] = 0;
  local_f8._17_8_ = 0;
  local_f8._0_8_ = (pointer)0x0;
  local_f8[8] = 0;
  local_f8._9_7_ = 0;
  memset(local_1a8,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_338,(_anonymous_namespace_ *)this_00,(Context *)local_248,(char *)code);
  local_318 = (size_type *)((ulong)local_318 & 0xffffffff00000000);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,local_338._M_dataplus._M_p,
             local_338._M_dataplus._M_p + local_338._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_318 & 0xffffffff) * 0x18),&local_310);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3a8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_278.m_contextInfo,(char *)code);
  local_388 = (size_type *)CONCAT44(local_388._4_4_,3);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_3a8._M_dataplus._M_p,
             local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_388 & 0xffffffff) * 0x18),&local_380);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_208,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_288,
             (char *)code);
  local_360 = (size_type *)CONCAT44(local_360._4_4_,4);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_360 & 0xffffffff) * 0x18),&local_358);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_238 + 0x10),(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_2c8._0_8_,(char *)code);
  local_2f0._0_4_ = 1;
  local_2f0._8_8_ = local_2e0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2f0 + 8),local_238._16_8_,
             (char *)(local_238._16_8_ + (long)&local_220->_M_dataplus));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + (local_2f0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2f0 + 8));
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_1a8);
  pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar8->strongRefCount = 0;
  pSVar8->weakRefCount = 0;
  pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b47b90;
  pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
  pSVar8->strongRefCount = 1;
  pSVar8->weakRefCount = 1;
  pSVar3 = (this->m_program).m_state;
  if (pSVar3 != pSVar8) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar3->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_program).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar3 = (this->m_program).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_01;
    (this->m_program).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar8->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[2])(pSVar8);
  }
  LOCK();
  pdVar1 = &pSVar8->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[1])(pSVar8);
  }
  if ((char *)local_2f0._8_8_ != local_2e0._M_local_buf + 8) {
    operator_delete((void *)local_2f0._8_8_,local_2e0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._16_8_ != &local_218) {
    operator_delete((void *)local_238._16_8_,local_218._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,
                    CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                             local_338.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_118);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk == false) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0xcb2);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((Context *)local_2c8._0_8_ != (Context *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,(ulong)((long)&(local_278.m_testCtx)->m_platform + 1));
  }
  if (local_278.m_contextInfo != (ContextInfo *)local_258) {
    operator_delete(local_278.m_contextInfo,(ulong)((long)(Platform **)local_258._0_8_ + 1));
  }
  if (local_248 != (ContextInfo *)local_238) {
    operator_delete(local_248,(ulong)((long)(Platform **)local_238._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  paVar9 = &local_1c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar9) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    paVar9 = extraout_RAX;
  }
  return (int)paVar9;
}

Assistant:

void PerPatchDataCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	DE_ASSERT(OUTPUT_PATCH_SIZE < INPUT_PATCH_SIZE);

	const string inSizeStr		= de::toString(INPUT_PATCH_SIZE);
	const string outSizeStr		= de::toString(OUTPUT_PATCH_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + outSizeStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch out mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch out mediump int in_te_patchVerticesInFromTCS;\n"
													  : "") +
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tin_te_primitiveIDFromTCS = gl_PrimitiveID;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n"
													  : "") +
													 "\n"
													 "	gl_TessLevelInner[0] = 9.0;\n"
													 "	gl_TessLevelInner[1] = 8.0;\n"
													 "\n"
													"	gl_TessLevelOuter[0] = 7.0;\n"
													"	gl_TessLevelOuter[1] = 6.0;\n"
													"	gl_TessLevelOuter[2] = 5.0;\n"
													"	gl_TessLevelOuter[3] = 4.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch in mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch in mediump int in_te_patchVerticesInFromTCS;\n"
													  : string()) +
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "uniform highp float u_xScale;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = (gl_TessCoord.x*u_xScale + in_te_attr[0]) * 2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y*2.0 - 1.0;\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tbool ok = in_te_primitiveIDFromTCS == 3;\n"
													  : m_caseType == CASETYPE_PRIMITIVE_ID_TES			? "\tbool ok = gl_PrimitiveID == 3;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tbool ok = in_te_patchVerticesInFromTCS == " + inSizeStr + ";\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TES	? "\tbool ok = gl_PatchVerticesIn == " + outSizeStr + ";\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER0_TES	? "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER1_TES	? "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER0_TES	? "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER1_TES	? "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER2_TES	? "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER3_TES	? "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n"
													  : DE_NULL) +
													  "	in_f_color = ok ? vec4(1.0) : vec4(vec3(0.0), 1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}